

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::EscapePhpdoc(string *__return_storage_ptr__,string *input)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  char cVar4;
  ulong uStack_38;
  char c;
  size_type i;
  char prev;
  string *input_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  i._3_1_ = '*';
  for (uStack_38 = 0; uVar2 = std::__cxx11::string::size(), uStack_38 < uVar2;
      uStack_38 = uStack_38 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
    cVar1 = *pcVar3;
    cVar4 = (char)__return_storage_ptr__;
    switch(cVar1) {
    case '&':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    default:
      std::__cxx11::string::push_back(cVar4);
      break;
    case '*':
      if (i._3_1_ == '/') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back(cVar4);
      }
      break;
    case '/':
      if (i._3_1_ == '*') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back(cVar4);
      }
      break;
    case '<':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case '>':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case '@':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case '\\':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    i._3_1_ = cVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static string EscapePhpdoc(const string& input) {
  string result;
  result.reserve(input.size() * 2);

  char prev = '*';

  for (string::size_type i = 0; i < input.size(); i++) {
    char c = input[i];
    switch (c) {
      case '*':
        // Avoid "/*".
        if (prev == '/') {
          result.append("&#42;");
        } else {
          result.push_back(c);
        }
        break;
      case '/':
        // Avoid "*/".
        if (prev == '*') {
          result.append("&#47;");
        } else {
          result.push_back(c);
        }
        break;
      case '@':
        // '@' starts phpdoc tags including the @deprecated tag, which will
        // cause a compile-time error if inserted before a declaration that
        // does not have a corresponding @Deprecated annotation.
        result.append("&#64;");
        break;
      case '<':
        // Avoid interpretation as HTML.
        result.append("&lt;");
        break;
      case '>':
        // Avoid interpretation as HTML.
        result.append("&gt;");
        break;
      case '&':
        // Avoid interpretation as HTML.
        result.append("&amp;");
        break;
      case '\\':
        // Java interprets Unicode escape sequences anywhere!
        result.append("&#92;");
        break;
      default:
        result.push_back(c);
        break;
    }

    prev = c;
  }

  return result;
}